

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * __thiscall
despot::util::tinyxml::TiXmlElement::ReadValue
          (TiXmlElement *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  int iVar1;
  TiXmlDocument *this_00;
  TiXmlText *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TiXmlNode *node_00;
  undefined4 extraout_var_01;
  bool bVar2;
  TiXmlNode *node;
  TiXmlText *textNode;
  char *pWithWhiteSpace;
  TiXmlDocument *document;
  TiXmlEncoding encoding_local;
  TiXmlParsingData *data_local;
  char *p_local;
  TiXmlElement *this_local;
  
  this_00 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  data_local = (TiXmlParsingData *)TiXmlBase::SkipWhiteSpace(p,encoding);
  textNode = (TiXmlText *)p;
  do {
    bVar2 = false;
    if (data_local != (TiXmlParsingData *)0x0) {
      bVar2 = (char)(data_local->cursor).row != '\0';
    }
    if (!bVar2) {
      if ((data_local == (TiXmlParsingData *)0x0) && (this_00 != (TiXmlDocument *)0x0)) {
        TiXmlDocument::SetError(this_00,6,(char *)0x0,(TiXmlParsingData *)0x0,encoding);
      }
      return (char *)data_local;
    }
    if ((char)(data_local->cursor).row == '<') {
      bVar2 = TiXmlBase::StringEqual((char *)data_local,"</",false,encoding);
      if (bVar2) {
        return (char *)data_local;
      }
      node_00 = TiXmlNode::Identify(&this->super_TiXmlNode,(char *)data_local,encoding);
      if (node_00 == (TiXmlNode *)0x0) {
        return (char *)0x0;
      }
      iVar1 = (*(node_00->super_TiXmlBase)._vptr_TiXmlBase[3])
                        (node_00,data_local,data,(ulong)encoding);
      data_local = (TiXmlParsingData *)CONCAT44(extraout_var_01,iVar1);
      TiXmlNode::LinkEndChild(&this->super_TiXmlNode,node_00);
    }
    else {
      this_01 = (TiXmlText *)operator_new(0x58);
      TiXmlText::TiXmlText(this_01,"");
      if (this_01 == (TiXmlText *)0x0) {
        if (this_00 != (TiXmlDocument *)0x0) {
          TiXmlDocument::SetError(this_00,3,(char *)0x0,(TiXmlParsingData *)0x0,encoding);
        }
        return (char *)0x0;
      }
      bVar2 = TiXmlBase::IsWhiteSpaceCondensed();
      if (bVar2) {
        iVar1 = (*(this_01->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[3])
                          (this_01,data_local,data,(ulong)encoding);
        data_local = (TiXmlParsingData *)CONCAT44(extraout_var,iVar1);
      }
      else {
        iVar1 = (*(this_01->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[3])
                          (this_01,textNode,data,(ulong)encoding);
        data_local = (TiXmlParsingData *)CONCAT44(extraout_var_00,iVar1);
      }
      bVar2 = TiXmlText::Blank(this_01);
      if (bVar2) {
        if (this_01 != (TiXmlText *)0x0) {
          (*(this_01->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[1])();
        }
      }
      else {
        TiXmlNode::LinkEndChild(&this->super_TiXmlNode,(TiXmlNode *)this_01);
      }
    }
    textNode = (TiXmlText *)data_local;
    data_local = (TiXmlParsingData *)TiXmlBase::SkipWhiteSpace((char *)data_local,encoding);
  } while( true );
}

Assistant:

const char* TiXmlElement::ReadValue(const char* p, TiXmlParsingData* data,
	TiXmlEncoding encoding) {
	TiXmlDocument* document = GetDocument();

	// Read in text and elements in any order.
	const char* pWithWhiteSpace = p;
	p = SkipWhiteSpace(p, encoding);

	while (p && *p) {
		if (*p != '<') {
			// Take what we have, make a text element.
			TiXmlText* textNode = new TiXmlText("");

			if (!textNode) {
				if (document)
					document->SetError(TIXML_ERROR_OUT_OF_MEMORY, 0, 0,
						encoding);
				return 0;
			}

			if (TiXmlBase::IsWhiteSpaceCondensed()) {
				p = textNode->Parse(p, data, encoding);
			} else {
				// Special case: we want to keep the white space
				// so that leading spaces aren't removed.
				p = textNode->Parse(pWithWhiteSpace, data, encoding);
			}

			if (!textNode->Blank())
				LinkEndChild(textNode);
			else
				delete textNode;
		} else {
			// We hit a '<'
			// Have we hit a new element or an end tag? This could also be
			// a TiXmlText in the "CDATA" style.
			if (StringEqual(p, "</", false, encoding)) {
				return p;
			} else {
				TiXmlNode* node = Identify(p, encoding);
				if (node) {
					p = node->Parse(p, data, encoding);
					LinkEndChild(node);
				} else {
					return 0;
				}
			}
		}
		pWithWhiteSpace = p;
		p = SkipWhiteSpace(p, encoding);
	}

	if (!p) {
		if (document)
			document->SetError(TIXML_ERROR_READING_ELEMENT_VALUE, 0, 0,
				encoding);
	}
	return p;
}